

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_util.c
# Opt level: O0

int archive_utility_string_sort_helper(char **strings,uint n)

{
  char *__s2;
  int iVar1;
  uint in_ESI;
  undefined8 *in_RDI;
  int retval2;
  int retval1;
  char *pivot;
  char **tmp;
  char **greater;
  char **lesser;
  uint greater_count;
  uint lesser_count;
  uint i;
  int local_4c;
  void *local_30;
  void *local_28;
  uint local_20;
  uint n_00;
  uint uVar2;
  int local_4;
  
  if (in_ESI < 2) {
    local_4 = 0;
  }
  else {
    local_20 = 0;
    n_00 = 0;
    local_30 = (void *)0x0;
    local_28 = (void *)0x0;
    __s2 = (char *)*in_RDI;
    for (uVar2 = 1; uVar2 < in_ESI; uVar2 = uVar2 + 1) {
      iVar1 = strcmp((char *)in_RDI[uVar2],__s2);
      if (iVar1 < 0) {
        n_00 = n_00 + 1;
        local_28 = realloc(local_28,(ulong)n_00 << 3);
        if (local_28 == (void *)0x0) {
          return -0x1e;
        }
        *(undefined8 *)((long)local_28 + (ulong)(n_00 - 1) * 8) = in_RDI[uVar2];
      }
      else {
        local_30 = realloc(local_30,(ulong)(local_20 + 1) << 3);
        if (local_30 == (void *)0x0) {
          return -0x1e;
        }
        *(undefined8 *)((long)local_30 + (ulong)local_20 * 8) = in_RDI[uVar2];
        local_20 = local_20 + 1;
      }
    }
    iVar1 = archive_utility_string_sort_helper((char **)CONCAT44(in_ESI,uVar2),n_00);
    for (uVar2 = 0; uVar2 < n_00; uVar2 = uVar2 + 1) {
      in_RDI[uVar2] = *(undefined8 *)((long)local_28 + (ulong)uVar2 * 8);
    }
    free(local_28);
    in_RDI[n_00] = __s2;
    local_4c = archive_utility_string_sort_helper((char **)CONCAT44(in_ESI,uVar2),n_00);
    for (uVar2 = 0; uVar2 < local_20; uVar2 = uVar2 + 1) {
      in_RDI[n_00 + 1 + uVar2] = *(undefined8 *)((long)local_30 + (ulong)uVar2 * 8);
    }
    free(local_30);
    if (iVar1 < local_4c) {
      local_4c = iVar1;
    }
    local_4 = local_4c;
  }
  return local_4;
}

Assistant:

static int
archive_utility_string_sort_helper(char **strings, unsigned int n)
{
  unsigned int i, lesser_count, greater_count;
  char **lesser, **greater, **tmp, *pivot;
  int retval1, retval2;

  /* A list of 0 or 1 elements is already sorted */
  if (n <= 1)
    return (ARCHIVE_OK);

  lesser_count = greater_count = 0;
  lesser = greater = NULL;
  pivot = strings[0];
  for (i = 1; i < n; i++)
  {
    if (strcmp(strings[i], pivot) < 0)
    {
      lesser_count++;
      tmp = (char **)realloc(lesser, lesser_count * sizeof(char *));
      if (!tmp)
        return (ARCHIVE_FATAL);
      lesser = tmp;
      lesser[lesser_count - 1] = strings[i];
    }
    else
    {
      greater_count++;
      tmp = (char **)realloc(greater, greater_count * sizeof(char *));
      if (!tmp)
        return (ARCHIVE_FATAL);
      greater = tmp;
      greater[greater_count - 1] = strings[i];
    }
  }

  /* quicksort(lesser) */
  retval1 = archive_utility_string_sort_helper(lesser, lesser_count);
  for (i = 0; i < lesser_count; i++)
    strings[i] = lesser[i];
  free(lesser);

  /* pivot */
  strings[lesser_count] = pivot;

  /* quicksort(greater) */
  retval2 = archive_utility_string_sort_helper(greater, greater_count);
  for (i = 0; i < greater_count; i++)
    strings[lesser_count + 1 + i] = greater[i];
  free(greater);

  return (retval1 < retval2) ? retval1 : retval2;
}